

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

UINT16 TPMS_ECC_PARMS_Marshal(TPMS_ECC_PARMS *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 UVar2;
  UINT16 UVar3;
  
  UVar1 = TPMT_SYM_DEF_OBJECT_Marshal(&source->symmetric,buffer,size);
  UVar2 = TPMT_ECC_SCHEME_Marshal(&source->scheme,buffer,size);
  UINT16_Marshal(&source->curveID,buffer,size);
  UVar3 = TPMT_KDF_SCHEME_Marshal(&source->kdf,buffer,size);
  return UVar3 + UVar2 + UVar1 + 2;
}

Assistant:

UINT16
TPMS_ECC_PARMS_Marshal(TPMS_ECC_PARMS *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPMT_SYM_DEF_OBJECT_Marshal((TPMT_SYM_DEF_OBJECT *)&(source->symmetric), buffer, size));
    result = (UINT16)(result + TPMT_ECC_SCHEME_Marshal((TPMT_ECC_SCHEME *)&(source->scheme), buffer, size));
    result = (UINT16)(result + TPMI_ECC_CURVE_Marshal((TPMI_ECC_CURVE *)&(source->curveID), buffer, size));
    result = (UINT16)(result + TPMT_KDF_SCHEME_Marshal((TPMT_KDF_SCHEME *)&(source->kdf), buffer, size));
    return result;
}